

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O0

bool __thiscall
crunch::process_input_spec(crunch *this,file_desc_vec *files,dynamic_string *input_spec)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  uint uVar5;
  char *pcVar6;
  file_desc_vec *this_00;
  bool success;
  find_files file_finder;
  dynamic_string find_filename;
  dynamic_string find_pathname;
  dynamic_string find_ext;
  dynamic_string find_fname;
  dynamic_string find_path;
  dynamic_string find_drive;
  bool deep_flag;
  dynamic_string find_name;
  dynamic_string *in_stack_00000708;
  dynamic_string *in_stack_00000710;
  dynamic_string *in_stack_00000718;
  dynamic_string *in_stack_00000720;
  char *in_stack_00000728;
  dynamic_string *in_stack_00000f48;
  dynamic_string *in_stack_fffffffffffffec8;
  find_files *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  uint in_stack_fffffffffffffedc;
  undefined4 uVar7;
  find_files *in_stack_fffffffffffffee0;
  command_line_params *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  char *in_stack_fffffffffffffef8;
  undefined5 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff05;
  undefined1 in_stack_ffffffffffffff06;
  undefined1 in_stack_ffffffffffffff07;
  dynamic_string *in_stack_ffffffffffffff08;
  find_files local_d0;
  char *in_stack_ffffffffffffff58;
  dynamic_string local_98;
  dynamic_string local_88;
  dynamic_string local_68;
  dynamic_string local_58;
  undefined1 local_41;
  undefined4 local_40;
  dynamic_string local_30 [2];
  byte local_1;
  
  crnlib::dynamic_string::dynamic_string
            ((dynamic_string *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  uVar5 = crnlib::dynamic_string::get_len(local_30);
  if (uVar5 != 0) {
    crnlib::dynamic_string::get_ptr(local_30);
    bVar1 = crnlib::file_utils::does_dir_exist(in_stack_ffffffffffffff58);
    if (bVar1) {
      in_stack_ffffffffffffff08 = local_30;
      crnlib::dynamic_string::get_ptr(in_stack_ffffffffffffff08);
      crnlib::file_utils::combine_path
                ((dynamic_string *)
                 CONCAT17(in_stack_ffffffffffffff07,
                          CONCAT16(in_stack_ffffffffffffff06,
                                   CONCAT15(in_stack_ffffffffffffff05,in_stack_ffffffffffffff00))),
                 in_stack_fffffffffffffef8,
                 (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    }
  }
  uVar2 = crnlib::dynamic_string::is_empty(local_30);
  if (((bool)uVar2) || (uVar3 = crnlib::file_utils::full_path(in_stack_00000f48), !(bool)uVar3)) {
    pcVar6 = crnlib::dynamic_string::get_ptr(local_30);
    crnlib::console::error("Invalid input filename: %s",pcVar6);
    local_1 = 0;
    local_40 = 1;
  }
  else {
    uVar4 = crnlib::command_line_params::get_value_as_bool
                      (in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
                       in_stack_fffffffffffffedc,SUB41((uint)in_stack_fffffffffffffed8 >> 0x18,0));
    local_41 = uVar4;
    crnlib::dynamic_string::dynamic_string(&local_58);
    crnlib::dynamic_string::dynamic_string(&local_68);
    crnlib::dynamic_string::dynamic_string((dynamic_string *)&stack0xffffffffffffff88);
    crnlib::dynamic_string::dynamic_string(&local_88);
    crnlib::dynamic_string::get_ptr(local_30);
    crnlib::file_utils::split_path
              (in_stack_00000728,in_stack_00000720,in_stack_00000718,in_stack_00000710,
               in_stack_00000708);
    crnlib::dynamic_string::dynamic_string(&local_98);
    pcVar6 = crnlib::dynamic_string::get_ptr(&local_58);
    crnlib::dynamic_string::get_ptr(&local_68);
    crnlib::file_utils::combine_path
              ((dynamic_string *)
               CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,in_stack_ffffffffffffff00))),pcVar6,
               (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    crnlib::dynamic_string::dynamic_string((dynamic_string *)&stack0xffffffffffffff58);
    crnlib::operator+(in_stack_ffffffffffffff08,
                      (dynamic_string *)
                      CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,in_stack_ffffffffffffff00))));
    crnlib::dynamic_string::operator=
              ((dynamic_string *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    uVar5 = (uint)((ulong)in_stack_fffffffffffffec8 >> 0x20);
    crnlib::dynamic_string::~dynamic_string((dynamic_string *)in_stack_fffffffffffffed0);
    crnlib::find_files::find_files(in_stack_fffffffffffffed0);
    crnlib::dynamic_string::get_ptr(&local_98);
    crnlib::dynamic_string::get_ptr((dynamic_string *)&stack0xffffffffffffff58);
    bVar1 = crnlib::find_files::find
                      (in_stack_fffffffffffffee0,
                       (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                       (char *)in_stack_fffffffffffffed0,uVar5);
    if (bVar1) {
      this_00 = crnlib::find_files::get_files(&local_d0);
      bVar1 = crnlib::vector<crnlib::find_files::file_desc>::empty(this_00);
      uVar7 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffedc);
      if (bVar1) {
        pcVar6 = crnlib::dynamic_string::get_ptr(local_30);
        crnlib::console::warning("No files found: %s",pcVar6);
        local_1 = 1;
      }
      else {
        in_stack_fffffffffffffed0 = (find_files *)crnlib::find_files::get_files(&local_d0);
        crnlib::vector<crnlib::find_files::file_desc>::append
                  (this_00,(vector<crnlib::find_files::file_desc> *)
                           CONCAT44(uVar7,in_stack_fffffffffffffed8));
        local_1 = 1;
      }
    }
    else {
      pcVar6 = crnlib::dynamic_string::get_ptr(local_30);
      crnlib::console::error("Failed finding files: %s",pcVar6);
      local_1 = 0;
    }
    local_40 = 1;
    crnlib::find_files::~find_files((find_files *)0x111106);
    crnlib::dynamic_string::~dynamic_string((dynamic_string *)in_stack_fffffffffffffed0);
    crnlib::dynamic_string::~dynamic_string((dynamic_string *)in_stack_fffffffffffffed0);
    crnlib::dynamic_string::~dynamic_string((dynamic_string *)in_stack_fffffffffffffed0);
    crnlib::dynamic_string::~dynamic_string((dynamic_string *)in_stack_fffffffffffffed0);
    crnlib::dynamic_string::~dynamic_string((dynamic_string *)in_stack_fffffffffffffed0);
    crnlib::dynamic_string::~dynamic_string((dynamic_string *)in_stack_fffffffffffffed0);
  }
  crnlib::dynamic_string::~dynamic_string((dynamic_string *)in_stack_fffffffffffffed0);
  return (bool)(local_1 & 1);
}

Assistant:

bool process_input_spec(find_files::file_desc_vec& files, const dynamic_string& input_spec) {
    dynamic_string find_name(input_spec);

    if ((find_name.get_len()) && (file_utils::does_dir_exist(find_name.get_ptr()))) {
      file_utils::combine_path(find_name, find_name.get_ptr(), "*");
    }

    if ((find_name.is_empty()) || (!file_utils::full_path(find_name))) {
      console::error("Invalid input filename: %s", find_name.get_ptr());
      return false;
    }

    const bool deep_flag = m_params.get_value_as_bool("deep");

    dynamic_string find_drive, find_path, find_fname, find_ext;
    file_utils::split_path(find_name.get_ptr(), &find_drive, &find_path, &find_fname, &find_ext);

    dynamic_string find_pathname;
    file_utils::combine_path(find_pathname, find_drive.get_ptr(), find_path.get_ptr());
    dynamic_string find_filename;
    find_filename = find_fname + find_ext;

    find_files file_finder;
    bool success = file_finder.find(find_pathname.get_ptr(), find_filename.get_ptr(), find_files::cFlagAllowFiles | (deep_flag ? find_files::cFlagRecursive : 0));
    if (!success) {
      console::error("Failed finding files: %s", find_name.get_ptr());
      return false;
    }

    if (file_finder.get_files().empty()) {
      console::warning("No files found: %s", find_name.get_ptr());
      return true;
    }

    files.append(file_finder.get_files());

    return true;
  }